

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_sub_int(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi_sint b)

{
  int iVar1;
  mbedtls_mpi_uint local_38;
  mbedtls_mpi_uint p [1];
  mbedtls_mpi B;
  mbedtls_mpi_sint b_local;
  mbedtls_mpi *A_local;
  mbedtls_mpi *X_local;
  
  local_38 = mpi_sint_abs(b);
  p[0] = (mbedtls_mpi_uint)&local_38;
  iVar1 = mbedtls_mpi_sub_mpi(X,A,(mbedtls_mpi *)p);
  return iVar1;
}

Assistant:

int mbedtls_mpi_sub_int(mbedtls_mpi *X, const mbedtls_mpi *A, mbedtls_mpi_sint b)
{
    mbedtls_mpi B;
    mbedtls_mpi_uint p[1];
    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(A != NULL);

    p[0] = mpi_sint_abs(b);
    B.s = TO_SIGN(b);
    B.n = 1;
    B.p = p;

    return mbedtls_mpi_sub_mpi(X, A, &B);
}